

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfbs_namer.h
# Opt level: O1

string * __thiscall
flatbuffers::BfbsNamer::Field_abi_cxx11_(string *__return_storage_ptr__,BfbsNamer *this,Field *f)

{
  ushort uVar1;
  ulong uVar2;
  long *local_40 [2];
  long local_30 [2];
  
  if (*(ushort *)(f + -(long)*(int *)f) < 5) {
    uVar1 = 0;
  }
  else {
    uVar1 = *(ushort *)(f + (4 - (long)*(int *)f));
  }
  uVar2 = (ulong)uVar1;
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_40,f + *(uint *)(f + uVar2) + uVar2 + 4,
             f + (ulong)*(uint *)(f + *(uint *)(f + uVar2) + uVar2) + *(uint *)(f + uVar2) + uVar2 +
                 4);
  (*(this->super_Namer)._vptr_Namer[0x12])(__return_storage_ptr__,this,(string *)local_40);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

virtual std::string Field(const ::reflection::Field &f) const {
    return Field(f.name()->str());
  }